

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O0

void __thiscall I2sAnalyzer::SetupResults(I2sAnalyzer *this)

{
  I2sAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  I2sAnalyzer *this_local;
  
  this_00 = (I2sAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<I2sAnalyzerSettings>::get(&this->mSettings);
  I2sAnalyzerResults::I2sAnalyzerResults(this_00,this,settings);
  std::auto_ptr<I2sAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<I2sAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<I2sAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<I2sAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void I2sAnalyzer::SetupResults()
{
    mResults.reset( new I2sAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mDataChannel );
}